

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

_Bool stumpless_element_has_param(stumpless_element *element,char *name)

{
  stumpless_param *param_00;
  _Bool _Var1;
  int iVar2;
  int cmp_result;
  stumpless_param *param;
  size_t i;
  size_t name_length;
  char *name_local;
  stumpless_element *element_local;
  
  name_length = (size_t)name;
  name_local = element->name;
  if (element == (stumpless_element *)0x0) {
    raise_argument_empty("element was NULL");
  }
  else if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else {
    _Var1 = validate_param_name(name,&i);
    if (_Var1) {
      clear_error();
      lock_element((stumpless_element *)name_local);
      for (param = (stumpless_param *)0x0; param < *(stumpless_param **)(name_local + 0x38);
          param = (stumpless_param *)(param->name + 1)) {
        param_00 = *(stumpless_param **)(*(long *)(name_local + 0x30) + (long)param * 8);
        lock_param(param_00);
        iVar2 = strcmp(param_00->name,(char *)name_length);
        unlock_param(param_00);
        if (iVar2 == 0) {
          unlock_element((stumpless_element *)name_local);
          return true;
        }
      }
      unlock_element((stumpless_element *)name_local);
    }
  }
  return false;
}

Assistant:

bool
stumpless_element_has_param( const struct stumpless_element *element,
                             const char *name ) {
  size_t name_length;
  size_t i;
  const struct stumpless_param *param;
  int cmp_result;

  if( !element ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "element" ) );
    return false;
  }

  if( !name ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "name" ) );
    return false;
  }

  if( unlikely( !validate_param_name( name, &name_length ) ) ) {
    return false;
  }

  clear_error(  );
  lock_element( element );
  FOR_EACH_PARAM_WITH_NAME( element, name )
    unlock_element( element );
    return true;
  }